

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_watthours_Test::TestBody(unitStrings_watthours_Test *this)

{
  bool bVar1;
  precise_unit *ppVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *psVar4;
  string *psVar5;
  precise_unit pVar6;
  AssertHelper local_380;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  precise_unit local_350;
  precise_unit local_340;
  string local_330;
  AssertHelper local_310;
  Message local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_7;
  precise_unit local_2e0;
  precise_unit local_2d0;
  undefined1 local_2c0 [8];
  string str;
  Message local_298;
  precise_unit local_290;
  precise_unit local_280;
  string local_270;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_6;
  Message local_238;
  precise_unit local_230;
  precise_unit local_220;
  string local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_5;
  Message local_1d8;
  precise_unit local_1d0;
  precise_unit local_1c0;
  string local_1b0;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  Message local_178;
  precise_unit local_170;
  precise_unit local_160;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  precise_unit local_110;
  precise_unit local_100;
  string local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  precise_unit local_b0;
  string local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  precise_unit local_50;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_watthours_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_50 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::A,(precise_unit *)units::precise::s);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_40;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_50,ppVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_20,"to_string(precise::A * precise::s)","\"C\"",psVar4,
             (char (*) [2])0x282eec);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    psVar4 = (string *)0x1b0;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_b0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::W,(precise_unit *)units::precise::hr);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_a0;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_b0,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_80,"to_string(precise::W * precise::hr)","\"Wh\"",psVar5,
             (char (*) [3])0x27f4a8);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    psVar5 = (string *)0x1b1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_110 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::W,(precise_unit *)units::precise::hr);
  local_100 = units::precise_unit::operator*(&local_110,(precise_unit *)units::precise::iflag);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_f0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_100,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_d0,"to_string(precise::W * precise::hr * precise::iflag)",
             "\"Wh*flag\"",psVar4,(char (*) [8])"Wh*flag");
  std::__cxx11::string::~string((string *)&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    psVar4 = (string *)0x1b2;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_170 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::W,(precise_unit *)units::precise::hr);
  local_160 = units::precise_unit::operator*(&local_170,(precise_unit *)units::precise::m);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_150;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_160,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_130,"to_string(precise::W * precise::hr * precise::m)","\"Wh*m\"",
             psVar5,(char (*) [5])0x27f4b4);
  std::__cxx11::string::~string((string *)&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    psVar5 = (string *)0x1b3;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_1d0 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::kilo,(precise_unit *)units::precise::W);
  local_1c0 = units::precise_unit::operator*(&local_1d0,(precise_unit *)units::precise::h);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_1b0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_1c0,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_190,"to_string(precise::kilo * precise::W * precise::h)","\"kWh\"",
             psVar4,(char (*) [4])0x2913c4);
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    psVar4 = (string *)0x1b4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_230 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::mega,(precise_unit *)units::precise::W);
  local_220 = units::precise_unit::operator*(&local_230,(precise_unit *)units::precise::h);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_210;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_220,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_1f0,"to_string(precise::mega * precise::W * precise::h)","\"MWh\"",
             psVar5,(char (*) [4])0x27d837);
  std::__cxx11::string::~string((string *)&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    psVar5 = (string *)0x1b5;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_290 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::giga,(precise_unit *)units::precise::W);
  local_280 = units::precise_unit::operator*(&local_290,(precise_unit *)units::precise::h);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_270;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_280,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_250,"to_string(precise::giga * precise::W * precise::h)","\"GWh\"",
             psVar4,(char (*) [4])0x27f4a7);
  std::__cxx11::string::~string((string *)&local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    psVar4 = (string *)0x1b6;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&str.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&str.field_2 + 8),&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&str.field_2 + 8));
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  join_0x00000000_0x00001200_ =
       units::precise_unit::operator*
                 ((precise_unit *)units::precise::giga,(precise_unit *)units::precise::W);
  local_2e0 = units::precise_unit::operator*
                        ((precise_unit *)&gtest_ar_7.message_,(precise_unit *)units::precise::h);
  local_2d0 = units::precise_unit::operator/((precise_unit *)units::precise::currency,&local_2e0);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = (string *)local_2c0;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_2d0,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_300,"str","\"$/GWh\"",psVar5,(char (*) [6])"$/GWh");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    psVar5 = (string *)0x1ba;
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1ba,pcVar3);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  pVar6 = units::precise_unit::operator*
                    ((precise_unit *)units::precise::giga,(precise_unit *)units::precise::W);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pVar6.multiplier_;
  local_350 = units::precise_unit::operator*
                        ((precise_unit *)&gtest_ar_8.message_,(precise_unit *)units::precise::h);
  local_340 = units::precise_unit::operator*((precise_unit *)units::precise::m,&local_350);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_330,(units *)&local_340,ppVar2,(uint64_t)psVar5);
  std::__cxx11::string::operator=((string *)local_2c0,(string *)&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_370,"str","\"GWh*m\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
             (char (*) [6])"GWh*m");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1bd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  std::__cxx11::string::~string((string *)local_2c0);
  return;
}

Assistant:

TEST(unitStrings, watthours)
{
    EXPECT_EQ(to_string(precise::A * precise::s), "C");
    EXPECT_EQ(to_string(precise::W * precise::hr), "Wh");
    EXPECT_EQ(to_string(precise::W * precise::hr * precise::iflag), "Wh*flag");
    EXPECT_EQ(to_string(precise::W * precise::hr * precise::m), "Wh*m");
    EXPECT_EQ(to_string(precise::kilo * precise::W * precise::h), "kWh");
    EXPECT_EQ(to_string(precise::mega * precise::W * precise::h), "MWh");
    EXPECT_EQ(to_string(precise::giga * precise::W * precise::h), "GWh");

    auto str = to_string(
        precise::currency / (precise::giga * precise::W * precise::h));
    EXPECT_EQ(str, "$/GWh");

    str = to_string(precise::m * (precise::giga * precise::W * precise::h));
    EXPECT_EQ(str, "GWh*m");
}